

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_se(bitstream *str,h264_cabac_context *cabac,h264_cabac_se_val *tab,int *ctxIdx,
                 uint32_t *val)

{
  h264_cabac_se_val *phVar1;
  uint32_t uVar2;
  int iVar3;
  h264_cabac_se_val *phVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  int bidx [8];
  uint32_t bit [8];
  uint32_t local_78 [18];
  
  if (str->dir == VS_ENCODE) {
    if (tab->blen != 0) {
      uVar2 = *val;
      do {
        if (tab->subtab == (h264_cabac_se_val *)0x0) {
          if (uVar2 == tab->val) goto LAB_0010b164;
        }
        else {
          iVar3 = in_tab(tab->subtab,uVar2);
          if (iVar3 != 0) {
LAB_0010b164:
            if (0 < tab->blen) {
              piVar5 = &tab->bits[0].val;
              lVar7 = 0;
              do {
                local_78[8] = *piVar5;
                iVar3 = h264_cabac_decision(str,cabac,
                                            ctxIdx[((h264_cabac_se_bit *)(piVar5 + -1))->bidx],
                                            local_78 + 8);
                if (iVar3 != 0) {
                  return 1;
                }
                lVar7 = lVar7 + 1;
                piVar5 = piVar5 + 2;
              } while (lVar7 < tab->blen);
            }
            phVar4 = tab->subtab;
            if (phVar4 == (h264_cabac_se_val *)0x0) {
              return 0;
            }
            goto LAB_0010b1e6;
          }
        }
        phVar4 = tab + 1;
        tab = tab + 1;
      } while (phVar4->blen != 0);
    }
    h264_cabac_se_cold_3();
  }
  else {
    local_78[4] = 0xffffffff;
    local_78[5] = 0xffffffff;
    local_78[6] = 0xffffffff;
    local_78[7] = 0xffffffff;
    local_78[0] = 0xffffffff;
    local_78[1] = 0xffffffff;
    local_78[2] = 0xffffffff;
    local_78[3] = 0xffffffff;
    if (tab->blen != 0) {
      piVar5 = &tab->blen;
      lVar7 = 0;
      do {
        phVar1 = tab + lVar7;
        lVar6 = 0;
        if (0 < *piVar5) {
          lVar6 = 0;
          do {
            if (local_78[lVar6] == 0xffffffff) {
              uVar2 = phVar1->bits[lVar6].bidx;
              local_78[lVar6] = uVar2;
              iVar3 = h264_cabac_decision(str,cabac,ctxIdx[(int)uVar2],local_78 + lVar6 + 8);
              if (iVar3 != 0) {
                return 1;
              }
            }
            if (local_78[lVar6] != phVar1->bits[lVar6].bidx) {
              h264_cabac_se_cold_1();
              return 1;
            }
          } while ((local_78[lVar6 + 8] == phVar1->bits[lVar6].val) &&
                  (lVar6 = lVar6 + 1, lVar6 < *piVar5));
        }
        if ((int)lVar6 == *piVar5) {
          phVar4 = phVar1->subtab;
          if (phVar4 == (h264_cabac_se_val *)0x0) {
            *val = phVar1->val;
            return 0;
          }
LAB_0010b1e6:
          iVar3 = h264_cabac_se(str,cabac,phVar4,ctxIdx,val);
          return iVar3;
        }
        piVar5 = &tab[lVar7 + 1].blen;
        lVar7 = lVar7 + 1;
      } while (*piVar5 != 0);
    }
    h264_cabac_se_cold_2();
  }
  return 1;
}

Assistant:

int h264_cabac_se(struct bitstream *str, struct h264_cabac_context *cabac, const struct h264_cabac_se_val *tab, int *ctxIdx, uint32_t *val) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (tab[i].subtab ? in_tab(tab[i].subtab, *val) : *val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j].val;
					if (h264_cabac_decision(str, cabac, ctxIdx[tab[i].bits[j].bidx], &bit))
						return 1;
				}
				if (tab[i].subtab)
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				else
					return 0;
			}
		}
		fprintf(stderr, "No binarization for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[8];
		int bidx[8];
		for (i = 0; i < 8; i++)
			bidx[i] = -1;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (bidx[j] == -1) {
					bidx[j] = tab[i].bits[j].bidx;
					if (h264_cabac_decision(str, cabac, ctxIdx[bidx[j]], &bit[j]))
						return 1;
				}
				if (bidx[j] != tab[i].bits[j].bidx) {
					fprintf(stderr, "Inconsistent CABAC se table!\n");
					return 1;
				}
				if (bit[j] != tab[i].bits[j].val)
					break;
			}
			if (j == tab[i].blen) {
				if (tab[i].subtab) {
					return h264_cabac_se(str, cabac, tab[i].subtab, ctxIdx, val);
				} else {
					*val = tab[i].val;
					return 0;
				}
			}
		}
		fprintf(stderr, "No value for a binarization\n");
		return 1;
	}
}